

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 ExprProcessFuncArguments
                (jx9_gen_state *pGen,jx9_expr_node *pOp,jx9_expr_node **apNode,sxi32 nToken)

{
  jx9_expr_node **apNode_00;
  uint uVar1;
  jx9_expr_node *pjVar2;
  bool bVar3;
  sxi32 sVar4;
  char *zFormat;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if (0 < nToken) {
    iVar8 = 0;
    do {
      iVar7 = iVar8 + 1;
      if (iVar8 + 1 < nToken) {
        iVar7 = nToken;
      }
      iVar6 = 0;
      lVar5 = (long)iVar8;
      do {
        pjVar2 = apNode[lVar5];
        if (pjVar2 != (jx9_expr_node *)0x0) {
          uVar1 = pjVar2->pStart->nType;
          if ((((uVar1 >> 0x11 & 1) != 0) && (pjVar2->pLeft == (jx9_expr_node *)0x0)) && (iVar6 < 1)
             ) {
            bVar3 = true;
            iVar7 = (int)lVar5;
            goto LAB_0012a347;
          }
          if ((uVar1 & 0xa40) == 0) {
            iVar6 = iVar6 + -1 + (uint)((uVar1 & 0x1480) == 0);
          }
          else {
            iVar6 = iVar6 + 1;
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (long)(ulong)(uint)nToken);
      bVar3 = false;
LAB_0012a347:
      if (iVar7 - iVar8 == 0 || iVar7 < iVar8) {
LAB_0012a3a3:
        zFormat = "Missing function argument";
LAB_0012a3b3:
        sVar4 = jx9GenCompileError(pGen,1,pOp->pStart->nLine,zFormat);
        return (uint)(sVar4 == -10) * 2 | 0xfffffff4;
      }
      apNode_00 = apNode + iVar8;
      ExprMakeTree(pGen,apNode_00,iVar7 - iVar8);
      if (*apNode_00 == (jx9_expr_node *)0x0) {
        zFormat = "Empty function argument";
        goto LAB_0012a3b3;
      }
      SySetPut(&pOp->aNodeArgs,apNode_00);
      iVar8 = iVar7;
      if (((bVar3) && (apNode[iVar7] != (jx9_expr_node *)0x0)) &&
         (((apNode[iVar7]->pStart->nType & 0x20000) != 0 && (iVar8 = iVar7 + 1, nToken <= iVar8))))
      goto LAB_0012a3a3;
    } while (iVar8 < nToken);
  }
  return 0;
}

Assistant:

static sxi32 ExprProcessFuncArguments(jx9_gen_state *pGen, jx9_expr_node *pOp, jx9_expr_node **apNode, sxi32 nToken)
{
	sxi32 iNest, iCur, iNode;
	sxi32 rc;
	/* Process function arguments from left to right */
	iCur = 0;
	for(;;){
		if( iCur >= nToken ){
			/* No more arguments to process */
			break;
		}
		iNode = iCur;
		iNest = 0;
		while( iCur < nToken ){
			if( apNode[iCur] ){
				if( (apNode[iCur]->pStart->nType & JX9_TK_COMMA) && apNode[iCur]->pLeft == 0 && iNest <= 0 ){
					break;
				}else if( apNode[iCur]->pStart->nType & (JX9_TK_LPAREN|JX9_TK_OSB|JX9_TK_OCB) ){
					iNest++;
				}else if( apNode[iCur]->pStart->nType & (JX9_TK_RPAREN|JX9_TK_CCB|JX9_TK_CSB) ){
					iNest--;
				}
			}
			iCur++;
		}
		if( iCur > iNode ){
			ExprMakeTree(&(*pGen), &apNode[iNode], iCur-iNode);
			if( apNode[iNode] ){
				/* Put a pointer to the root of the tree in the arguments set */
				SySetPut(&pOp->aNodeArgs, (const void *)&apNode[iNode]);
			}else{
				/* Empty function argument */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Empty function argument");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
		}else{
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Missing function argument");
			if( rc != SXERR_ABORT ){
				rc = SXERR_SYNTAX;
			}
			return rc;
		}
		/* Jump trailing comma */
		if( iCur < nToken && apNode[iCur] && (apNode[iCur]->pStart->nType & JX9_TK_COMMA) ){
			iCur++;
			if( iCur >= nToken ){
				/* missing function argument */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Missing function argument");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
		}
	}
	return SXRET_OK;
}